

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O0

void xmlNanoHTTPScanAnswer(xmlNanoHTTPCtxtPtr ctxt,char *line)

{
  int iVar1;
  char *pcVar2;
  xmlChar *pxVar3;
  z_stream *pzVar4;
  long lVar5;
  bool bVar6;
  xmlChar *tmp_loc;
  xmlChar *tmp_http;
  xmlChar *mime_1;
  xmlChar *last_1;
  xmlChar *charset_1;
  xmlChar *mime;
  xmlChar *last;
  xmlChar *charset;
  int ret;
  int version;
  char *cur;
  char *line_local;
  xmlNanoHTTPCtxtPtr ctxt_local;
  
  if (line != (char *)0x0) {
    iVar1 = strncmp(line,"HTTP/",5);
    if (iVar1 == 0) {
      charset._4_4_ = 0;
      charset._0_4_ = 0;
      _ret = (xmlChar *)(line + 5);
      while( true ) {
        bVar6 = false;
        if ('/' < (char)*_ret) {
          bVar6 = (char)*_ret < ':';
        }
        if (!bVar6) break;
        charset._4_4_ = (char)*_ret + -0x30 + charset._4_4_ * 10;
        _ret = (xmlChar *)((char *)_ret + 1);
      }
      if (*_ret == '.') {
        pcVar2 = (char *)_ret + 1;
        if (('/' < *pcVar2) && (*pcVar2 < ':')) {
          charset._4_4_ = *pcVar2 + -0x30 + charset._4_4_ * 10;
          pcVar2 = (char *)_ret + 2;
        }
        while( true ) {
          _ret = (xmlChar *)pcVar2;
          bVar6 = false;
          if ('/' < (char)*_ret) {
            bVar6 = (char)*_ret < ':';
          }
          if (!bVar6) break;
          pcVar2 = (char *)_ret + 1;
        }
      }
      else {
        charset._4_4_ = charset._4_4_ * 10;
      }
      if ((*_ret == ' ') || (*_ret == '\t')) {
        while( true ) {
          bVar6 = true;
          if (*_ret != ' ') {
            bVar6 = *_ret == '\t';
          }
          if (!bVar6) break;
          _ret = (xmlChar *)((char *)_ret + 1);
        }
        if (('/' < (char)*_ret) && ((char)*_ret < ':')) {
          while( true ) {
            bVar6 = false;
            if ('/' < (char)*_ret) {
              bVar6 = (char)*_ret < ':';
            }
            if (!bVar6) break;
            charset._0_4_ = (char)*_ret + -0x30 + (int)charset * 10;
            _ret = (xmlChar *)((char *)_ret + 1);
          }
          if (((*_ret == '\0') || (*_ret == ' ')) || (*_ret == '\t')) {
            ctxt->returnValue = (int)charset;
            ctxt->version = charset._4_4_;
          }
        }
      }
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)line,(xmlChar *)"Content-Type:",0xd);
      if (iVar1 == 0) {
        _ret = (xmlChar *)(line + 0xd);
        while( true ) {
          bVar6 = true;
          if (*_ret != ' ') {
            bVar6 = *_ret == '\t';
          }
          if (!bVar6) break;
          _ret = _ret + 1;
        }
        if (ctxt->contentType != (char *)0x0) {
          (*xmlFree)(ctxt->contentType);
        }
        pcVar2 = (*xmlMemStrdup)((char *)_ret);
        ctxt->contentType = pcVar2;
        mime = _ret;
        while( true ) {
          bVar6 = false;
          if (((*mime != '\0') && (bVar6 = false, *mime != ' ')) &&
             ((bVar6 = false, *mime != '\t' && (bVar6 = false, *mime != ';')))) {
            bVar6 = *mime != ',';
          }
          if (!bVar6) break;
          mime = mime + 1;
        }
        if (ctxt->mimeType != (char *)0x0) {
          (*xmlFree)(ctxt->mimeType);
        }
        pxVar3 = xmlStrndup(_ret,(int)mime - (int)_ret);
        ctxt->mimeType = (char *)pxVar3;
        pxVar3 = xmlStrstr((xmlChar *)ctxt->contentType,"charset=");
        if (pxVar3 != (xmlChar *)0x0) {
          pxVar3 = pxVar3 + 8;
          mime = pxVar3;
          while( true ) {
            bVar6 = false;
            if ((((*mime != '\0') && (bVar6 = false, *mime != ' ')) &&
                (bVar6 = false, *mime != '\t')) && (bVar6 = false, *mime != ';')) {
              bVar6 = *mime != ',';
            }
            if (!bVar6) break;
            mime = mime + 1;
          }
          if (ctxt->encoding != (char *)0x0) {
            (*xmlFree)(ctxt->encoding);
          }
          pxVar3 = xmlStrndup(pxVar3,(int)mime - (int)pxVar3);
          ctxt->encoding = (char *)pxVar3;
        }
      }
      else {
        iVar1 = xmlStrncasecmp((xmlChar *)line,(xmlChar *)"ContentType:",0xc);
        if (iVar1 == 0) {
          _ret = (xmlChar *)(line + 0xc);
          if (ctxt->contentType == (char *)0x0) {
            while( true ) {
              bVar6 = true;
              if (*_ret != ' ') {
                bVar6 = *_ret == '\t';
              }
              if (!bVar6) break;
              _ret = _ret + 1;
            }
            pcVar2 = (*xmlMemStrdup)((char *)_ret);
            ctxt->contentType = pcVar2;
            mime_1 = _ret;
            while( true ) {
              bVar6 = false;
              if ((((*mime_1 != '\0') && (bVar6 = false, *mime_1 != ' ')) &&
                  (bVar6 = false, *mime_1 != '\t')) && (bVar6 = false, *mime_1 != ';')) {
                bVar6 = *mime_1 != ',';
              }
              if (!bVar6) break;
              mime_1 = mime_1 + 1;
            }
            if (ctxt->mimeType != (char *)0x0) {
              (*xmlFree)(ctxt->mimeType);
            }
            pxVar3 = xmlStrndup(_ret,(int)mime_1 - (int)_ret);
            ctxt->mimeType = (char *)pxVar3;
            pxVar3 = xmlStrstr((xmlChar *)ctxt->contentType,"charset=");
            if (pxVar3 != (xmlChar *)0x0) {
              pxVar3 = pxVar3 + 8;
              mime_1 = pxVar3;
              while( true ) {
                bVar6 = false;
                if (((*mime_1 != '\0') && (bVar6 = false, *mime_1 != ' ')) &&
                   ((bVar6 = false, *mime_1 != '\t' && (bVar6 = false, *mime_1 != ';')))) {
                  bVar6 = *mime_1 != ',';
                }
                if (!bVar6) break;
                mime_1 = mime_1 + 1;
              }
              if (ctxt->encoding != (char *)0x0) {
                (*xmlFree)(ctxt->encoding);
              }
              pxVar3 = xmlStrndup(pxVar3,(int)mime_1 - (int)pxVar3);
              ctxt->encoding = (char *)pxVar3;
            }
          }
        }
        else {
          iVar1 = xmlStrncasecmp((xmlChar *)line,(xmlChar *)"Location:",9);
          if (iVar1 == 0) {
            _ret = (xmlChar *)(line + 9);
            while( true ) {
              bVar6 = true;
              if (*_ret != ' ') {
                bVar6 = *_ret == '\t';
              }
              if (!bVar6) break;
              _ret = _ret + 1;
            }
            if (ctxt->location != (char *)0x0) {
              (*xmlFree)(ctxt->location);
            }
            if (*_ret == '/') {
              pxVar3 = xmlStrdup((xmlChar *)"http://");
              pxVar3 = xmlStrcat(pxVar3,(xmlChar *)ctxt->hostname);
              pxVar3 = xmlStrcat(pxVar3,_ret);
              ctxt->location = (char *)pxVar3;
            }
            else {
              pcVar2 = (*xmlMemStrdup)((char *)_ret);
              ctxt->location = pcVar2;
            }
          }
          else {
            iVar1 = xmlStrncasecmp((xmlChar *)line,(xmlChar *)"WWW-Authenticate:",0x11);
            if (iVar1 == 0) {
              _ret = (xmlChar *)(line + 0x11);
              while( true ) {
                bVar6 = true;
                if (*_ret != ' ') {
                  bVar6 = *_ret == '\t';
                }
                if (!bVar6) break;
                _ret = (xmlChar *)((char *)_ret + 1);
              }
              if (ctxt->authHeader != (char *)0x0) {
                (*xmlFree)(ctxt->authHeader);
              }
              pcVar2 = (*xmlMemStrdup)((char *)_ret);
              ctxt->authHeader = pcVar2;
            }
            else {
              iVar1 = xmlStrncasecmp((xmlChar *)line,(xmlChar *)"Proxy-Authenticate:",0x13);
              if (iVar1 == 0) {
                _ret = (xmlChar *)(line + 0x13);
                while( true ) {
                  bVar6 = true;
                  if (*_ret != ' ') {
                    bVar6 = *_ret == '\t';
                  }
                  if (!bVar6) break;
                  _ret = (xmlChar *)((char *)_ret + 1);
                }
                if (ctxt->authHeader != (char *)0x0) {
                  (*xmlFree)(ctxt->authHeader);
                }
                pcVar2 = (*xmlMemStrdup)((char *)_ret);
                ctxt->authHeader = pcVar2;
              }
              else {
                iVar1 = xmlStrncasecmp((xmlChar *)line,(xmlChar *)"Content-Encoding:",0x11);
                if (iVar1 == 0) {
                  _ret = (xmlChar *)(line + 0x11);
                  while( true ) {
                    bVar6 = true;
                    if (*_ret != ' ') {
                      bVar6 = *_ret == '\t';
                    }
                    if (!bVar6) break;
                    _ret = _ret + 1;
                  }
                  iVar1 = xmlStrncasecmp(_ret,"gzip",4);
                  if (iVar1 == 0) {
                    ctxt->usesGzip = 1;
                    pzVar4 = (z_stream *)(*xmlMalloc)(0x70);
                    ctxt->strm = pzVar4;
                    if (ctxt->strm != (z_stream *)0x0) {
                      ctxt->strm->zalloc = (alloc_func)0x0;
                      ctxt->strm->zfree = (free_func)0x0;
                      ctxt->strm->opaque = (voidpf)0x0;
                      ctxt->strm->avail_in = 0;
                      ctxt->strm->next_in = (Bytef *)0x0;
                      inflateInit2_(ctxt->strm,0x1f,"1.2.11",0x70);
                    }
                  }
                }
                else {
                  iVar1 = xmlStrncasecmp((xmlChar *)line,(xmlChar *)"Content-Length:",0xf);
                  if (iVar1 == 0) {
                    lVar5 = strtol(line + 0xf,(char **)0x0,10);
                    ctxt->ContentLength = (int)lVar5;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlNanoHTTPScanAnswer(xmlNanoHTTPCtxtPtr ctxt, const char *line) {
    const char *cur = line;

    if (line == NULL) return;

    if (!strncmp(line, "HTTP/", 5)) {
        int version = 0;
	int ret = 0;

	cur += 5;
	while ((*cur >= '0') && (*cur <= '9')) {
	    version *= 10;
	    version += *cur - '0';
	    cur++;
	}
	if (*cur == '.') {
	    cur++;
	    if ((*cur >= '0') && (*cur <= '9')) {
		version *= 10;
		version += *cur - '0';
		cur++;
	    }
	    while ((*cur >= '0') && (*cur <= '9'))
		cur++;
	} else
	    version *= 10;
	if ((*cur != ' ') && (*cur != '\t')) return;
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	if ((*cur < '0') || (*cur > '9')) return;
	while ((*cur >= '0') && (*cur <= '9')) {
	    ret *= 10;
	    ret += *cur - '0';
	    cur++;
	}
	if ((*cur != 0) && (*cur != ' ') && (*cur != '\t')) return;
	ctxt->returnValue = ret;
        ctxt->version = version;
    } else if (!xmlStrncasecmp(BAD_CAST line, BAD_CAST"Content-Type:", 13)) {
        const xmlChar *charset, *last, *mime;
        cur += 13;
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	if (ctxt->contentType != NULL)
	    xmlFree(ctxt->contentType);
	ctxt->contentType = xmlMemStrdup(cur);
	mime = (const xmlChar *) cur;
	last = mime;
	while ((*last != 0) && (*last != ' ') && (*last != '\t') &&
	       (*last != ';') && (*last != ','))
	    last++;
	if (ctxt->mimeType != NULL)
	    xmlFree(ctxt->mimeType);
	ctxt->mimeType = (char *) xmlStrndup(mime, last - mime);
	charset = xmlStrstr(BAD_CAST ctxt->contentType, BAD_CAST "charset=");
	if (charset != NULL) {
	    charset += 8;
	    last = charset;
	    while ((*last != 0) && (*last != ' ') && (*last != '\t') &&
	           (*last != ';') && (*last != ','))
		last++;
	    if (ctxt->encoding != NULL)
	        xmlFree(ctxt->encoding);
	    ctxt->encoding = (char *) xmlStrndup(charset, last - charset);
	}
    } else if (!xmlStrncasecmp(BAD_CAST line, BAD_CAST"ContentType:", 12)) {
        const xmlChar *charset, *last, *mime;
        cur += 12;
	if (ctxt->contentType != NULL) return;
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	ctxt->contentType = xmlMemStrdup(cur);
	mime = (const xmlChar *) cur;
	last = mime;
	while ((*last != 0) && (*last != ' ') && (*last != '\t') &&
	       (*last != ';') && (*last != ','))
	    last++;
	if (ctxt->mimeType != NULL)
	    xmlFree(ctxt->mimeType);
	ctxt->mimeType = (char *) xmlStrndup(mime, last - mime);
	charset = xmlStrstr(BAD_CAST ctxt->contentType, BAD_CAST "charset=");
	if (charset != NULL) {
	    charset += 8;
	    last = charset;
	    while ((*last != 0) && (*last != ' ') && (*last != '\t') &&
	           (*last != ';') && (*last != ','))
		last++;
	    if (ctxt->encoding != NULL)
	        xmlFree(ctxt->encoding);
	    ctxt->encoding = (char *) xmlStrndup(charset, last - charset);
	}
    } else if (!xmlStrncasecmp(BAD_CAST line, BAD_CAST"Location:", 9)) {
        cur += 9;
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	if (ctxt->location != NULL)
	    xmlFree(ctxt->location);
	if (*cur == '/') {
	    xmlChar *tmp_http = xmlStrdup(BAD_CAST "http://");
	    xmlChar *tmp_loc =
	        xmlStrcat(tmp_http, (const xmlChar *) ctxt->hostname);
	    ctxt->location =
	        (char *) xmlStrcat (tmp_loc, (const xmlChar *) cur);
	} else {
	    ctxt->location = xmlMemStrdup(cur);
	}
    } else if (!xmlStrncasecmp(BAD_CAST line, BAD_CAST"WWW-Authenticate:", 17)) {
        cur += 17;
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	if (ctxt->authHeader != NULL)
	    xmlFree(ctxt->authHeader);
	ctxt->authHeader = xmlMemStrdup(cur);
    } else if (!xmlStrncasecmp(BAD_CAST line, BAD_CAST"Proxy-Authenticate:", 19)) {
        cur += 19;
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	if (ctxt->authHeader != NULL)
	    xmlFree(ctxt->authHeader);
	ctxt->authHeader = xmlMemStrdup(cur);
#ifdef LIBXML_ZLIB_ENABLED
    } else if ( !xmlStrncasecmp( BAD_CAST line, BAD_CAST"Content-Encoding:", 17) ) {
	cur += 17;
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	if ( !xmlStrncasecmp( BAD_CAST cur, BAD_CAST"gzip", 4) ) {
	    ctxt->usesGzip = 1;

	    ctxt->strm = xmlMalloc(sizeof(z_stream));

	    if (ctxt->strm != NULL) {
		ctxt->strm->zalloc = Z_NULL;
		ctxt->strm->zfree = Z_NULL;
		ctxt->strm->opaque = Z_NULL;
		ctxt->strm->avail_in = 0;
		ctxt->strm->next_in = Z_NULL;

		inflateInit2( ctxt->strm, 31 );
	    }
	}
#endif
    } else if ( !xmlStrncasecmp( BAD_CAST line, BAD_CAST"Content-Length:", 15) ) {
	cur += 15;
	ctxt->ContentLength = strtol( cur, NULL, 10 );
    }
}